

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_clone_alloc(wally_psbt *psbt,uint32_t flags,wally_psbt **output)

{
  uchar uVar1;
  int iVar2;
  wally_psbt *pwVar3;
  int iVar4;
  int ret;
  
  if (output != (wally_psbt **)0x0) {
    *output = (wally_psbt *)0x0;
  }
  iVar4 = -2;
  if ((psbt != (wally_psbt *)0x0 && output != (wally_psbt **)0x0) && flags == 0) {
    iVar2 = *(int *)psbt->magic;
    uVar1 = psbt->magic[4];
    iVar4 = wally_psbt_init_alloc
                      (psbt->version,psbt->inputs_allocation_len,psbt->outputs_allocation_len,
                       (psbt->unknowns).items_allocation_len,output);
    if ((uVar1 == 0xff && iVar2 == 0x74657370) && iVar4 == 0) {
      pwVar3 = *output;
      pwVar3->magic[4] = 0xff;
      pwVar3->magic[0] = 'p';
      pwVar3->magic[1] = 's';
      pwVar3->magic[2] = 'e';
      pwVar3->magic[3] = 't';
    }
    if (iVar4 == 0) {
      pwVar3 = *output;
      pwVar3->num_inputs = psbt->num_inputs;
      pwVar3->num_outputs = psbt->num_outputs;
      iVar4 = psbt_combine(pwVar3,psbt);
      if (iVar4 == 0) {
        if (psbt->tx == (wally_tx *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = wally_tx_clone_alloc(psbt->tx,0,&(*output)->tx);
        }
      }
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        wally_psbt_free(*output);
        *output = (wally_psbt *)0x0;
      }
    }
  }
  return iVar4;
}

Assistant:

int wally_psbt_clone_alloc(const struct wally_psbt *psbt, uint32_t flags,
                           struct wally_psbt **output)
{
#ifdef BUILD_ELEMENTS
    size_t is_elements;
#endif /* BUILD_ELEMENTS */
    int ret;

    if (output)
        *output = NULL;
    if (!psbt || flags || !output)
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    if (is_elements)
        ret = wally_psbt_elements_init_alloc(psbt->version,
                                             psbt->inputs_allocation_len,
                                             psbt->outputs_allocation_len,
                                             psbt->unknowns.items_allocation_len,
                                             output);
    else
#endif /* BUILD_ELEMENTS */
    ret = wally_psbt_init_alloc(psbt->version,
                                psbt->inputs_allocation_len,
                                psbt->outputs_allocation_len,
                                psbt->unknowns.items_allocation_len,
                                output);
    if (ret == WALLY_OK) {
        (*output)->num_inputs = psbt->num_inputs;
        (*output)->num_outputs = psbt->num_outputs;
        ret = psbt_combine(*output, psbt);

        if (ret == WALLY_OK && psbt->tx)
            ret = tx_clone_alloc(psbt->tx, &(*output)->tx);
        if (ret != WALLY_OK) {
            wally_psbt_free(*output);
            *output = NULL;
        }
    }
    return ret;
}